

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O0

error_or<int> * __thiscall
pstore::http::
serve_static_content<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_4c539acc sender,int io,
          string *path,romfs *file_system)

{
  anon_class_32_4_bb30a193 f;
  string *__file;
  ulong uVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  romfs *this_00;
  not_null<const_char_*> local_78;
  error_or<pstore::romfs::stat> local_70;
  string *local_50;
  romfs *prStack_48;
  undefined1 *local_40;
  int *piStack_38;
  string *local_30;
  romfs *file_system_local;
  string *path_local;
  http *phStack_18;
  int io_local;
  anon_class_8_1_4c539acc sender_local;
  
  this_00 = (romfs *)CONCAT44(in_register_0000000c,io);
  path_local._4_4_ = SUB84(sender.actual,0);
  local_30 = path;
  file_system_local = this_00;
  phStack_18 = this;
  sender_local.actual = (string *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)this_00,"/");
  }
  pcVar2 = (char *)std::__cxx11::string::back();
  if (*pcVar2 == '/') {
    std::__cxx11::string::operator+=((string *)this_00,"index.html");
  }
  __file = local_30;
  local_50 = local_30;
  local_40 = (undefined1 *)&stack0xffffffffffffffe8;
  piStack_38 = (int *)((long)&path_local + 4);
  prStack_48 = this_00;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pstore::gsl::not_null<const_char_*>::not_null(&local_78,pcVar2);
  pstore::romfs::romfs::stat((romfs *)&local_70,(char *)__file,(stat *)local_78.ptr_);
  f.path = (string *)prStack_48;
  f.file_system = (romfs *)local_50;
  f.sender = (anon_class_8_1_4c539acc *)local_40;
  f.io = piStack_38;
  pstore::operator>>=(__return_storage_ptr__,&local_70,f);
  error_or<pstore::romfs::stat>::~error_or(&local_70);
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> serve_static_content (Sender sender, IO io, std::string path,
                                                   pstore::romfs::romfs const & file_system) {
            if (path.empty ()) {
                path = "/";
            }
            if (path.back () == '/') {
                path += "index.html";
            }

            return file_system.stat (path.c_str ()) >>= [&] (pstore::romfs::stat const & stat) {
                return file_system.open (path.c_str ()) >>= [&] (pstore::romfs::descriptor fd) {
                    // Send the response header.
                    std::ostringstream os;
                    os << "HTTP/1.0 200 OK" << crlf               //
                       << "Server: " << server_name << crlf       //
                       << "Content-length: " << stat.size << crlf //
                       << "Content-type: " << pstore::http::media_type_from_filename (path)
                       << crlf //
                       << "Connection: close"
                       << crlf // TODO remove this when we support persistent connections
                       << "Date: " << http_date (std::chrono::system_clock::now ()) << crlf //
                       << "Last-Modified: " << http_date (stat.mtime) << crlf               //
                       << crlf;
                    return send (sender, io, os.str ()) >>=
                           [&] (IO io2) { return details::read_and_send (sender, io2, fd); };
                };
            };
        }